

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

string * __thiscall
glcts::GeometryShaderGetProgramiv3Test::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderGetProgramiv3Test *this,_run *run)

{
  ostream *poVar1;
  char *this_00;
  GeometryShaderGetProgramiv3Test *this_01;
  stringstream code_sstream;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(";
  poVar1 = std::operator<<(&local_190,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(");
  getLayoutQualifierForPrimitiveType_abi_cxx11_
            (&local_1c0,(GeometryShaderGetProgramiv3Test *)this_00,run->input_primitive_type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,", invocations = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,run->invocations);
  this_01 = (GeometryShaderGetProgramiv3Test *)0x16bb9d3;
  poVar1 = std::operator<<(poVar1,") in;\nlayout(");
  getLayoutQualifierForPrimitiveType_abi_cxx11_(&local_1e0,this_01,run->output_primitive_type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,", max_vertices = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,run->max_vertices);
  poVar1 = std::operator<<(poVar1,
                           ") out;\n\nout gl_PerVertex {\n    vec4 gl_Position;\n};\n\nvoid main()\n{\n    for (int n = 0; n < "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,run->max_vertices);
  std::operator<<(poVar1,
                  "; ++n)\n    {\n        gl_Position = vec4(n, 0.0, 0.0, 1.0);\n        EmitVertex();\n    }\n\n    EndPrimitive();\n}\n"
                 );
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderGetProgramiv3Test::getGSCode(const _run& run)
{
	std::stringstream code_sstream;

	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout("
				 << getLayoutQualifierForPrimitiveType(run.input_primitive_type) << ", "
																					"invocations = "
				 << run.invocations << ") in;\n"
									   "layout("
				 << getLayoutQualifierForPrimitiveType(run.output_primitive_type) << ", "
																					 "max_vertices = "
				 << run.max_vertices << ") out;\n"
										"\n"
										"out gl_PerVertex {\n"
										"    vec4 gl_Position;\n"
										"};\n"
										"\n"
										"void main()\n"
										"{\n"
										"    for (int n = 0; n < "
				 << run.max_vertices << "; ++n)\n"
										"    {\n"
										"        gl_Position = vec4(n, 0.0, 0.0, 1.0);\n"
										"        EmitVertex();\n"
										"    }\n"
										"\n"
										"    EndPrimitive();\n"
										"}\n";

	return code_sstream.str();
}